

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

string_view __thiscall
wabt::anon_unknown_14::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  string_view sVar1;
  bool bVar2;
  __type _Var3;
  string *__rhs;
  char *pcVar4;
  size_type sVar5;
  reference pvVar6;
  int __c;
  int __c_00;
  Var *__s;
  string_view sVar7;
  string *label;
  int i;
  Var *var_local;
  NameApplier *this_local;
  char *local_10;
  
  __s = var;
  bVar2 = Var::is_name(var);
  if (bVar2) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    label._4_4_ = (int)sVar5;
    do {
      label._4_4_ = label._4_4_ + -1;
      if (label._4_4_ < 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        sVar1._M_str = local_10;
        sVar1._M_len = (size_t)this_local;
        return sVar1;
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->labels_,(long)label._4_4_);
      __rhs = Var::name_abi_cxx11_(var);
      _Var3 = std::operator==(pvVar6,__rhs);
    } while (!_Var3);
    sVar7 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
  }
  else {
    pcVar4 = Var::index(var,(char *)__s,__c);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    if (((ulong)pcVar4 & 0xffffffff) < sVar5) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->labels_);
      pcVar4 = Var::index(var,(char *)__s,__c_00);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->labels_,(sVar5 - 1) - ((ulong)pcVar4 & 0xffffffff));
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar7._M_str = local_10;
      sVar7._M_len = (size_t)this_local;
    }
  }
  return sVar7;
}

Assistant:

std::string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return std::string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return std::string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}